

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContextInit.cpp
# Opt level: O3

ContextInitializer * __thiscall
Imf_3_4::ContextInitializer::setInputStream(ContextInitializer *this,IStream *istr)

{
  int iVar1;
  undefined8 *puVar2;
  code *pcVar3;
  
  puVar2 = (undefined8 *)operator_new(0x30);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[3] = 0;
  puVar2[4] = 0;
  puVar2[5] = istr;
  (this->_initializer).user_data = puVar2;
  iVar1 = (*istr->_vptr_IStream[9])(istr);
  pcVar3 = istream_nonparallel_read;
  if ((char)iVar1 != '\0') {
    pcVar3 = istream_threadsafe_read;
  }
  (this->_initializer).read_fn = pcVar3;
  (this->_initializer).size_fn = istream_size;
  (this->_initializer).write_fn = (exr_write_func_ptr_t)0x0;
  (this->_initializer).destroy_fn = istream_destroy;
  this->_ctxt_type = READ;
  this->_prov_stream = istr;
  return this;
}

Assistant:

ContextInitializer&
ContextInitializer::setInputStream (IStream* istr)
{
    _initializer.user_data  = new istream_holder{istr};
    if (istr->isStatelessRead ())
        _initializer.read_fn = istream_threadsafe_read;
    else
        _initializer.read_fn = istream_nonparallel_read;
    _initializer.size_fn    = istream_size;
    _initializer.write_fn   = nullptr;
    _initializer.destroy_fn = istream_destroy;
    _ctxt_type              = ContextFileType::READ;
    _prov_stream            = istr;
    return *this;
}